

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O2

void outputErrorLine(EOutputVerbosity errorLevel,int keywordPos,int keywordSz)

{
  size_t sVar1;
  FILE *__stream;
  long lStack_40;
  
  if ((keywordPos < 0) || (sVar1 = strlen(ErrorLine), (int)sVar1 < keywordSz + keywordPos)) {
    __assert_fail("0 <= keywordPos && 1 <= keywordSz && keywordPos + keywordSz <= int(strlen(ErrorLine))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                  ,0x44,"void outputErrorLine(const EOutputVerbosity, int, int)");
  }
  __stream = (FILE *)GetListingFile();
  if ((__stream == (FILE *)0x0) && ((int)errorLevel < Options::OutputVerbosity)) {
    return;
  }
  trimAndAddEol(ErrorLine);
  trimAndAddEol(ErrorLine2);
  if ((__stream != (FILE *)0x0) && (fputs(ErrorLine,__stream), ErrorLine2[0] != '\0')) {
    fputs(ErrorLine2,__stream);
  }
  if ((int)errorLevel < Options::OutputVerbosity) {
    return;
  }
  if (keywordPos != 0) {
    std::ostream::write((char *)&std::cerr,0x186820);
  }
  if (errorLevel == OV_ERROR) {
    lStack_40 = 0x18;
  }
  else {
    if (errorLevel != OV_WARNING) goto LAB_0011379e;
    lStack_40 = 0x10;
  }
  std::operator<<((ostream *)&std::cerr,*(char **)(Options::tcols + lStack_40));
LAB_0011379e:
  std::ostream::write((char *)&std::cerr,(long)(ErrorLine + (uint)keywordPos));
  std::operator<<((ostream *)&std::cerr,*(char **)Options::tcols);
  std::operator<<((ostream *)&std::cerr,ErrorLine + (uint)keywordPos + (uint)keywordSz);
  if (ErrorLine2[0] == '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cerr,ErrorLine2);
  return;
}

Assistant:

static void outputErrorLine(const EOutputVerbosity errorLevel, int keywordPos, int keywordSz) {
	assert(0 <= keywordPos && 1 <= keywordSz && keywordPos + keywordSz <= int(strlen(ErrorLine)));	// keyword is mandatory
	auto lstFile = GetListingFile();
	if (!lstFile && errorLevel < Options::OutputVerbosity) return;	// no output required
	// trim end of error/warning line and add EOL char if needed
	trimAndAddEol(ErrorLine);
	trimAndAddEol(ErrorLine2);
	// always print the message into listing file (the OutputVerbosity does not apply to listing)
	if (lstFile) {
		fputs(ErrorLine, lstFile);
		if (*ErrorLine2) fputs(ErrorLine2, lstFile);
	}
	// print the error into stderr if OutputVerbosity allows this type of message
	if (Options::OutputVerbosity <= errorLevel) {
		if (keywordPos) cerr.write(ErrorLine, keywordPos);	// output filename and line position
		// colorize the keyword in message
		if (OV_ERROR == errorLevel) _CERR Options::tcols->error _END;
		if (OV_WARNING == errorLevel) _CERR Options::tcols->warning _END;
		cerr.write(ErrorLine + keywordPos, keywordSz);
		// switch color off for rest of message
		_CERR Options::tcols->end _END;
		_CERR ErrorLine + keywordPos + keywordSz _END;
		if (*ErrorLine2) _CERR ErrorLine2 _END;
	}
}